

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O1

UINT8 device_start_k054539(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  double dVar2;
  UINT8 UVar3;
  DEV_DATA DVar4;
  long lVar5;
  void *pvVar6;
  k054539_state *info;
  
  DVar4.chipInf = calloc(1,0xbd0);
  if ((DEV_DATA *)DVar4.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    lVar5 = 0x110;
    do {
      ((DEV_DATA *)((long)DVar4.chipInf + lVar5 * 8))->chipInf = (void *)0x3ff0000000000000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x118);
    *(undefined1 *)&((DEV_DATA *)((long)DVar4.chipInf + 0x8d8))->chipInf = 0;
    lVar5 = 0;
    do {
      dVar2 = pow(10.0,((double)(int)lVar5 * -36.0 * 0.015625) / 20.0);
      *(double *)((long)DVar4.chipInf + lVar5 * 8 + 8) = dVar2 * 0.25;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
    lVar5 = 0;
    do {
      dVar2 = (double)(int)lVar5;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      *(double *)((long)DVar4.chipInf + lVar5 * 8 + 0x808) = dVar2 / 3.7416573867739413;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xf);
    *(UINT32 *)((long)DVar4.chipInf + 0xbcc) = cfg->clock;
    *(byte *)&((DEV_DATA *)((long)DVar4.chipInf + 0x8d8))->chipInf =
         *(byte *)&((DEV_DATA *)((long)DVar4.chipInf + 0x8d8))->chipInf | 4;
    pvVar6 = malloc(0x4000);
    ((DEV_DATA *)((long)DVar4.chipInf + 0xb10))->chipInf = pvVar6;
    ((DEV_DATA *)((long)DVar4.chipInf + 0xb30))->chipInf = (void *)0x0;
    *(undefined8 *)((long)DVar4.chipInf + 0xb38) = 0;
    *(UINT8 *)&((DEV_DATA *)((long)DVar4.chipInf + 0x8d8))->chipInf = cfg->flags;
    UVar3 = '\0';
    ((DEV_DATA *)((long)DVar4.chipInf + 0xbc0))->chipInf = (void *)0x0;
    *(void **)DVar4.chipInf = DVar4.chipInf;
    uVar1 = *(uint *)((long)DVar4.chipInf + 0xbcc);
    retDevInf->dataPtr = (DEV_DATA *)DVar4.chipInf;
    retDevInf->sampleRate = uVar1 / 0x180;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_k054539(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	int i;
	k054539_state *info;

	info = (k054539_state *)calloc(1, sizeof(k054539_state));
	if (info == NULL)
		return 0xFF;

	//info->timer = timer_alloc(0);

	// resolve / bind callbacks
	//info->timer_handler.resolve_safe();
	//info->apan_cb.bind_relative_to(*owner());

	for (i = 0; i < 8; i++)
		info->gain[i] = 1.0;

	info->flags = K054539_RESET_FLAGS;

	/*
	    I've tried various equations on volume control but none worked consistently.
	    The upper four channels in most MW/GX games simply need a significant boost
	    to sound right. For example, the bass and smash sound volumes in Violent Storm
	    have roughly the same values and the voices in Tokimeki Puzzledama are given
	    values smaller than those of the hihats. Needless to say the two K054539 chips
	    in Mystic Warriors are completely out of balance. Rather than forcing a
	    "one size fits all" function to the voltab the current invert exponential
	    appraoch seems most appropriate.
	*/
	// Factor the 1/4 for the number of channels in the volume (1/8 is too harsh, 1/2 gives clipping)
	// vol=0 -> no attenuation, vol=0x40 -> -36dB
	for(i=0; i<256; i++)
		info->voltab[i] = pow(10.0, (-36.0 * (double)i / (double)0x40) / 20.0) / 4.0;

	// Pan table for the left channel
	// Right channel is identical with inverted index
	// Formula is such that pan[i]**2+pan[0xe-i]**2 = 1 (constant output power)
	// and pan[0xe] = 1 (full panning)
	for(i=0; i<0xf; i++)
		info->pantab[i] = sqrt((double)i) / sqrt((double)0xe);

	info->clock = cfg->clock;

	info->flags |= K054539_UPDATE_AT_KEYON; //* make it default until proven otherwise

	info->ram = (UINT8*)malloc(0x4000);
	info->rom = NULL;
	info->rom_size = 0x00;
	info->rom_mask = 0x00;

	k054539_init_flags(info, cfg->flags);

	k054539_set_mute_mask(info, 0x00);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->clock / 384, &devDef);

	return 0x00;
}